

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainNN.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long *plVar6;
  long *plVar7;
  double *pdVar8;
  void *pvVar9;
  void *pvVar10;
  void *__s;
  void *__s_00;
  int iVar11;
  NaStdBackProp *this;
  ulong uVar12;
  size_t __n;
  double dVar13;
  undefined8 uVar14;
  NaNNUnit nn;
  NaQuickProp qpe;
  NaStdBackProp bpe;
  int local_15d0;
  long *local_15c8;
  long *local_15c0;
  int local_15a4;
  NaNNUnit local_1580 [148];
  int local_14ec;
  int local_14e8;
  int local_14e4;
  uint local_14dc;
  long local_f90;
  double adStack_f88 [263];
  NaStdBackProp local_750 [1824];
  
  if (argc < 4) {
    printf("Usage: %s NN-file LearnIn LearnOut [TestIn TestOut [NN-out]]\n",*argv);
    iVar11 = 1;
  }
  else {
    NaOpenLogFile("TrainNN.log");
    signal(2,handle_sigint);
    pcVar5 = getenv("MAX_EPOCHS");
    if (pcVar5 == (char *)0x0) {
      local_15a4 = -1;
    }
    else {
      local_15a4 = atoi(pcVar5);
    }
    plVar6 = (long *)OpenInputDataFile(argv[2]);
    plVar7 = (long *)OpenInputDataFile(argv[3]);
    local_15c8 = plVar7;
    local_15c0 = plVar6;
    if (argc != 4) {
      pcVar5 = argv[4];
      if ((*pcVar5 != '-') || (pcVar5[1] != '\0')) {
        local_15c0 = (long *)OpenInputDataFile(pcVar5);
      }
      if ((5 < (uint)argc) && ((pcVar5 = argv[5], *pcVar5 != '-' || (pcVar5[1] != '\0')))) {
        local_15c8 = (long *)OpenInputDataFile(pcVar5);
      }
    }
    NaNNUnit::NaNNUnit(local_1580);
    NaNNUnit::Load((char *)local_1580);
    this = local_750;
    NaStdBackProp::NaStdBackProp(this,local_1580);
    NaQuickProp::NaQuickProp((NaQuickProp *)&local_f90,local_1580);
    pcVar5 = getenv("QPROP_MU");
    if (pcVar5 != (char *)0x0) {
      dVar13 = atof(pcVar5);
      *(double *)((long)adStack_f88 + *(long *)(local_f90 + -0x18)) = dVar13;
      this = (NaStdBackProp *)((NaQuickProp *)&local_f90 + *(long *)(local_f90 + -0x28));
    }
    uVar12 = (ulong)local_14dc;
    pdVar8 = (double *)
             operator_new__((ulong)(local_14e4 * local_14dc + local_14e8 * local_14ec) << 3);
    uVar12 = uVar12 << 3;
    pvVar9 = operator_new__(uVar12);
    pvVar10 = operator_new__(uVar12);
    __s = operator_new__(uVar12);
    __s_00 = operator_new__(uVar12);
    if (bTerminate == false) {
      iVar11 = 0;
      do {
        if ((ulong)local_14dc != 0) {
          __n = (ulong)local_14dc << 3;
          memset(__s_00,0,__n);
          memset(__s,0,__n);
        }
        cVar2 = (**(code **)(*plVar6 + 0x28))();
        if ((cVar2 != '\0') && (cVar2 = (**(code **)(*plVar7 + 0x28))(), cVar2 != '\0')) {
          local_15d0 = 0;
          do {
            if (local_14e4 * local_14dc + local_14e8 * local_14ec != 0) {
              uVar12 = 0;
              do {
                dVar13 = (double)(**(code **)(*plVar6 + 0x18))(plVar6,uVar12 & 0xffffffff);
                pdVar8[uVar12] = dVar13;
                uVar12 = uVar12 + 1;
              } while (uVar12 < local_14e4 * local_14dc + local_14e8 * local_14ec);
            }
            if (local_14dc != 0) {
              uVar12 = 0;
              do {
                uVar14 = (**(code **)(*plVar7 + 0x18))(plVar7,uVar12 & 0xffffffff);
                *(undefined8 *)((long)pvVar9 + uVar12 * 8) = uVar14;
                uVar12 = uVar12 + 1;
              } while (uVar12 < local_14dc);
            }
            NaNNUnit::Function((double *)local_1580,pdVar8);
            if ((ulong)local_14dc != 0) {
              uVar12 = 0;
              do {
                dVar13 = *(double *)((long)pvVar9 + uVar12 * 8) -
                         *(double *)((long)pvVar10 + uVar12 * 8);
                *(double *)((long)__s + uVar12 * 8) =
                     dVar13 * dVar13 + *(double *)((long)__s + uVar12 * 8);
                uVar12 = uVar12 + 1;
              } while (local_14dc != uVar12);
            }
            iVar3 = NaNNUnit::OutputLayer();
            if (-1 < iVar3) {
              do {
                iVar4 = NaNNUnit::OutputLayer();
                if (iVar3 == iVar4) {
                  (**(code **)(*(long *)this + 0x30))(this,pvVar9,0);
                }
                else {
                  (**(code **)(*(long *)this + 0x38))(this,iVar3,iVar3 + 1);
                }
                bVar1 = 0 < iVar3;
                iVar3 = iVar3 + -1;
              } while (bVar1);
            }
            cVar2 = (**(code **)(*plVar6 + 0x20))();
            local_15d0 = local_15d0 + 1;
          } while ((cVar2 != '\0') && (cVar2 = (**(code **)(*plVar7 + 0x20))(), cVar2 != '\0'));
          if ((ulong)local_14dc != 0) {
            uVar12 = 0;
            do {
              *(double *)((long)__s + uVar12 * 8) =
                   *(double *)((long)__s + uVar12 * 8) / (double)local_15d0;
              uVar12 = uVar12 + 1;
            } while (local_14dc != uVar12);
          }
        }
        cVar2 = (**(code **)(*local_15c0 + 0x28))();
        if ((cVar2 != '\0') && (cVar2 = (**(code **)(*local_15c8 + 0x28))(), cVar2 != '\0')) {
          iVar3 = 0;
          do {
            if (local_14e4 * local_14dc + local_14e8 * local_14ec != 0) {
              uVar12 = 0;
              do {
                dVar13 = (double)(**(code **)(*local_15c0 + 0x18))(local_15c0,uVar12 & 0xffffffff);
                pdVar8[uVar12] = dVar13;
                uVar12 = uVar12 + 1;
              } while (uVar12 < local_14e4 * local_14dc + local_14e8 * local_14ec);
            }
            if (local_14dc != 0) {
              uVar12 = 0;
              do {
                uVar14 = (**(code **)(*local_15c8 + 0x18))(local_15c8,uVar12 & 0xffffffff);
                *(undefined8 *)((long)pvVar9 + uVar12 * 8) = uVar14;
                uVar12 = uVar12 + 1;
              } while (uVar12 < local_14dc);
            }
            NaNNUnit::Function((double *)local_1580,pdVar8);
            if ((ulong)local_14dc != 0) {
              uVar12 = 0;
              do {
                dVar13 = *(double *)((long)pvVar9 + uVar12 * 8) -
                         *(double *)((long)pvVar10 + uVar12 * 8);
                *(double *)((long)__s_00 + uVar12 * 8) =
                     dVar13 * dVar13 + *(double *)((long)__s_00 + uVar12 * 8);
                uVar12 = uVar12 + 1;
              } while (local_14dc != uVar12);
            }
            cVar2 = (**(code **)(*local_15c0 + 0x20))();
            iVar3 = iVar3 + 1;
          } while ((cVar2 != '\0') && (cVar2 = (**(code **)(*local_15c8 + 0x20))(), cVar2 != '\0'));
          if ((ulong)local_14dc != 0) {
            uVar12 = 0;
            do {
              *(double *)((long)__s_00 + uVar12 * 8) =
                   *(double *)((long)__s_00 + uVar12 * 8) / (double)iVar3;
              uVar12 = uVar12 + 1;
            } while (local_14dc != uVar12);
          }
        }
        (**(code **)(*(long *)this + 0x28))(this);
        printf("%d\t");
        if (local_14dc != 0) {
          uVar12 = 0;
          do {
            printf(" %g",*(undefined8 *)((long)__s + uVar12 * 8));
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_14dc);
        }
        putchar(9);
        if (local_14dc != 0) {
          uVar12 = 0;
          do {
            printf(" %g",*(undefined8 *)((long)__s_00 + uVar12 * 8));
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_14dc);
        }
        putchar(10);
        if (local_15a4 <= iVar11) {
          bTerminate = true;
          break;
        }
        iVar11 = iVar11 + 1;
      } while ((bTerminate & 1U) == 0);
    }
    NaNNUnit::Save((char *)local_1580);
    NaQuickProp::~NaQuickProp((NaQuickProp *)&local_f90);
    NaStdBackProp::~NaStdBackProp(local_750);
    NaNNUnit::~NaNNUnit(local_1580);
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc < 4)
    {
      printf("Usage: %s NN-file LearnIn LearnOut [TestIn TestOut [NN-out]]\n",
	     argv[0]);
      return 1;
    }

  NaOpenLogFile("TrainNN.log");

  /* Let's handle SIGINT(2) */
  signal(SIGINT, handle_sigint);

  int	nMaxEpochs = -1;	// unlimited
  char	*szMaxEpochs = getenv("MAX_EPOCHS");
  if(NULL != szMaxEpochs) {
      nMaxEpochs = atoi(szMaxEpochs);
  }

  try{
    NaDataFile	*dfLeIn = OpenInputDataFile(argv[2]);
    NaDataFile	*dfLeOut = OpenInputDataFile(argv[3]);

    NaDataFile	*dfTeIn = dfLeIn, *dfTeOut = dfLeOut;

    if(argc > 4 && strcmp(argv[4], "-"))
      dfTeIn = OpenInputDataFile(argv[4]);
    if(argc > 5 && strcmp(argv[5], "-"))
      dfTeOut = OpenInputDataFile(argv[5]);

    NaNNUnit            nn;
    nn.Load(argv[1]);

    NaStdBackProp	bpe(nn);
    NaQuickProp		qpe(nn);
    NaStdBackProp	*nnteacher = &bpe;

    char		*szQPropMu = getenv("QPROP_MU");
    if(NULL != szQPropMu) {
	qpe.mu = atof(szQPropMu);
	nnteacher = &qpe;
    }

    /* Prepare buffers for input, target and output data */
    NaReal	*pIn = new NaReal[nn.descr.InputsNumber()];
    NaReal	*pTar = new NaReal[nn.descr.nOutNeurons];
    NaReal	*pOut = new NaReal[nn.descr.nOutNeurons];

    NaReal	*pLeMSE = new NaReal[nn.descr.nOutNeurons];
    NaReal	*pTeMSE = new NaReal[nn.descr.nOutNeurons];

    /* Let's start the learning */
    int	iEpoch = 0, iLayer, j;

    while(!bTerminate)
      {
	++iEpoch;

	/* Reset error counters */
	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  pLeMSE[j] = pTeMSE[j] = 0.0;

	/* Learning epoch */
	if(dfLeIn->GoStartRecord() && dfLeOut->GoStartRecord())
	  {
	    int	nSamples = 0;

	    do{
	      /* Read the learning pair */
	      for(j = 0; j < nn.descr.InputsNumber(); ++j)
		pIn[j] = dfLeIn->GetValue(j);
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTar[j] = dfLeOut->GetValue(j);

	      /* Pass through the net in forward direction */
	      nn.Function(pIn, pOut);

	      /* Compute sum of squared error */
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pLeMSE[j] += (pTar[j] - pOut[j]) * (pTar[j] - pOut[j]);

	      /* Pass through the net in backward direction */
	      for(iLayer = nn.OutputLayer(); iLayer >= 0; --iLayer)
		{
		  if(nn.OutputLayer() == iLayer)
		    /* Output layer */
		    nnteacher->DeltaRule(pTar);
		  else
		    /* Hidden layer */
		    nnteacher->DeltaRule(iLayer, iLayer + 1);
		}

	      ++nSamples;

	    }while(dfLeIn->GoNextRecord() && dfLeOut->GoNextRecord());

	    /* Compute mean squared error */
	    for(j = 0; j < nn.descr.nOutNeurons; ++j)
	      pLeMSE[j] /= nSamples;
	  }

	/* Testing epoch */
	if(dfTeIn->GoStartRecord() && dfTeOut->GoStartRecord())
	  {
	    int	nSamples = 0;

	    do{
	      /* Read the learning pair */
	      for(j = 0; j < nn.descr.InputsNumber(); ++j)
		pIn[j] = dfTeIn->GetValue(j);
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTar[j] = dfTeOut->GetValue(j);

	      /* Pass through the net in forward direction */
	      nn.Function(pIn, pOut);

	      /* Compute sum of squared error */
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTeMSE[j] += (pTar[j] - pOut[j]) * (pTar[j] - pOut[j]);

	      ++nSamples;

	    }while(dfTeIn->GoNextRecord() && dfTeOut->GoNextRecord());

	    /* Compute mean squared error */
	    for(j = 0; j < nn.descr.nOutNeurons; ++j)
	      pTeMSE[j] /= nSamples;
	  }

	/* Update the NN weights at the end of each epoch */
	nnteacher->UpdateNN();

	/* Display epoch number, learning and testing errors */
	printf("%d\t", iEpoch);

	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  printf(" %g", pLeMSE[j]);

	putchar('\t');

	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  printf(" %g", pTeMSE[j]);

	putchar('\n');

	if(iEpoch > nMaxEpochs)
	    bTerminate = true;

      }/* End of learning loop */

    if(argc > 6)
      nn.Save(argv[6]);
    else
      nn.Save(argv[1]);
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }
}